

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::get
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this,
          ExceptionOrValue *output)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  ExceptionOrValue::operator=(output,&(this->result).super_ExceptionOrValue);
  if (&this->result != (ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)output)
  {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      pcVar1 = output[1].exception.ptr.field_1.value.ownFile.content.ptr;
      if (pcVar1 != (char *)0x0) {
        sVar2 = output[1].exception.ptr.field_1.value.ownFile.content.size_;
        output[1].exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        output[1].exception.ptr.field_1.value.ownFile.content.size_ = 0;
        pAVar3 = output[1].exception.ptr.field_1.value.ownFile.content.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,0x88,sVar2,sVar2,0);
      }
    }
    if ((this->result).value.ptr.isSet == true) {
      output[1].exception.ptr.field_1.value.ownFile.content.ptr =
           (char *)(this->result).value.ptr.field_1.value.ptr;
      output[1].exception.ptr.field_1.value.ownFile.content.size_ =
           (this->result).value.ptr.field_1.value.size_;
      output[1].exception.ptr.field_1.value.ownFile.content.disposer =
           (this->result).value.ptr.field_1.value.disposer;
      (this->result).value.ptr.field_1.value.ptr = (SocketAddress *)0x0;
      (this->result).value.ptr.field_1.value.size_ = 0;
      output[1].exception.ptr.isSet = true;
    }
  }
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = kj::mv(result);
  }